

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnElemSegmentElemExpr_RefFunc
          (BinaryReaderIR *this,Index segment_index,Index func_index)

{
  pointer ppEVar1;
  ElemSegment *pEVar2;
  char *__s;
  Offset OVar3;
  _func_int ***ppp_Var4;
  Expr *pEVar5;
  Expr *pEVar6;
  ExprList init_expr;
  Location loc;
  intrusive_list<wabt::Expr> local_b8;
  Location local_98;
  Var local_70;
  
  ppEVar1 = (this->module_->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((long)(this->module_->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) - 1U != (ulong)segment_index) {
    __assert_fail("segment_index == module_->elem_segments.size() - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/binary-reader-ir.cc"
                  ,0x524,
                  "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnElemSegmentElemExpr_RefFunc(Index, Index)"
                 );
  }
  pEVar2 = ppEVar1[segment_index];
  local_98.field_1.field_0.line = 0;
  local_98.field_1.field_0.first_column = 0;
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = 0;
  local_98.filename._M_str._0_4_ = 0;
  local_98.filename._M_str._4_4_ = 0;
  __s = this->filename_;
  local_98.filename._M_len = strlen(__s);
  local_98.filename._M_str._0_4_ = SUB84(__s,0);
  local_98.filename._M_str._4_4_ = (undefined4)((ulong)__s >> 0x20);
  OVar3 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_98.field_1.field_0.line = (int)OVar3;
  local_98.field_1.field_0.first_column = (int)(OVar3 >> 0x20);
  local_b8.first_ = (Expr *)0x0;
  local_b8.last_ = (Expr *)0x0;
  local_b8.size_ = 0;
  Var::Var(&local_70,func_index,&local_98);
  pEVar6 = (Expr *)operator_new(0x88);
  (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_0018c660;
  (pEVar6->loc).filename._M_len = local_98.filename._M_len;
  (pEVar6->loc).filename._M_str =
       (char *)CONCAT44(local_98.filename._M_str._4_4_,local_98.filename._M_str._0_4_);
  (pEVar6->loc).field_1.field_1.offset =
       CONCAT44(local_98.field_1.field_0.first_column,local_98.field_1.field_0.line);
  *(ulong *)((long)&(pEVar6->loc).field_1 + 8) =
       CONCAT44(local_98.field_1._12_4_,local_98.field_1.field_0.last_column);
  pEVar6->type_ = RefFunc;
  pEVar6->_vptr_Expr = (_func_int **)&PTR__VarExpr_0018d470;
  Var::Var((Var *)(pEVar6 + 1),&local_70);
  if (((pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ == (Expr *)0x0) &&
     ((pEVar6->super_intrusive_list_base<wabt::Expr>).next_ == (Expr *)0x0)) {
    pEVar5 = pEVar6;
    if (local_b8.last_ != (Expr *)0x0) {
      (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = local_b8.last_;
      ((local_b8.last_)->super_intrusive_list_base<wabt::Expr>).next_ = pEVar6;
      pEVar5 = local_b8.first_;
    }
    local_b8.first_ = pEVar5;
    local_b8.size_ = local_b8.size_ + 1;
    local_b8.last_ = pEVar6;
    Var::~Var(&local_70);
    std::vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>::
    emplace_back<wabt::intrusive_list<wabt::Expr>>
              ((vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>
                *)&pEVar2->elem_exprs,&local_b8);
    pEVar6 = local_b8.first_;
    while (pEVar6 != (Expr *)0x0) {
      ppp_Var4 = &pEVar6->_vptr_Expr;
      pEVar6 = (pEVar6->super_intrusive_list_base<wabt::Expr>).next_;
      (*(*ppp_Var4)[1])();
    }
    return (Result)Ok;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                ,0x1bd,
                "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
               );
}

Assistant:

Result BinaryReaderIR::OnElemSegmentElemExpr_RefFunc(Index segment_index,
                                                     Index func_index) {
  assert(segment_index == module_->elem_segments.size() - 1);
  ElemSegment* segment = module_->elem_segments[segment_index];
  Location loc = GetLocation();
  ExprList init_expr;
  init_expr.push_back(std::make_unique<RefFuncExpr>(Var(func_index, loc), loc));
  segment->elem_exprs.push_back(std::move(init_expr));
  return Result::Ok;
}